

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O0

float __thiscall asl::Var::operator_cast_to_float(Var *this)

{
  Array<char> *this_00;
  char *__nptr;
  double dVar1;
  Var *this_local;
  
  switch(this->_type) {
  case NUL:
    dVar1 = nan((char *)this);
    this_local._4_4_ = SUB84(dVar1,0);
    break;
  case NUMBER:
  case FLOAT:
    this_local._4_4_ = (float)(this->field_1)._d;
    break;
  default:
    this_local._4_4_ = 0.0;
    break;
  case INT:
    this_local._4_4_ = (float)(this->field_1)._i;
    break;
  case SSTRING:
    dVar1 = atof((this->field_1)._ss);
    this_local._4_4_ = (float)dVar1;
    break;
  case STRING:
    this_00 = StaticSpace<asl::Array<char>_>::operator->(&(this->field_1)._s);
    __nptr = Array<char>::data(this_00);
    dVar1 = atof(__nptr);
    this_local._4_4_ = (float)dVar1;
  }
  return this_local._4_4_;
}

Assistant:

Var::operator float() const
{
	switch(_type) {
	case NUMBER:
	case FLOAT:
		return (float)_d;
	case INT:
		return (float)_i;
	case STRING:
		return (float)atof(_s->data());
	case SSTRING:
		return (float)atof(_ss);
	case NUL:
		return nan();
	default: break;
	}
	return 0.0; // NaN ?
}